

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall CService::GetKey(CService *this)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  CNetAddr *in_stack_00000008;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::GetAddrBytes(in_stack_00000008);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (in_stack_ffffffffffffffa8,(value_type_conflict *)0xe01eac);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (in_stack_ffffffffffffffa8,(value_type_conflict *)0xe01ec9);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<unsigned char> CService::GetKey() const
{
    auto key = GetAddrBytes();
    key.push_back(port / 0x100); // most significant byte of our port
    key.push_back(port & 0x0FF); // least significant byte of our port
    return key;
}